

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * google::protobuf::compiler::java::anon_unknown_0::StripPackageName
                   (string *__return_storage_ptr__,string *full_name,FileDescriptor *file)

{
  if (*(long *)(*(long *)(file + 8) + 8) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)full_name);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)full_name);
  }
  return __return_storage_ptr__;
}

Assistant:

string StripPackageName(const string& full_name,
                        const FileDescriptor* file) {
  if (file->package().empty()) {
    return full_name;
  } else {
    // Strip package name
    return full_name.substr(file->package().size() + 1);
  }
}